

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     global_scan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
               (long begin,long end,long out,undefined1 param_4,comm *param_5)

{
  int iVar1;
  size_t i;
  long lVar2;
  int iVar3;
  T sum;
  comm nonzero_comm;
  undefined4 local_54;
  comm local_50;
  
  comm::split(&local_50,param_5,(uint)(end - begin != 0));
  if (end - begin != 0) {
    local_scan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
              (begin,end,out);
    local_54 = *(undefined4 *)(out + -4 + (end - begin));
    iVar1 = exscan<int,mxx::min<int>>(&local_54,&local_50,param_4);
    if (local_50.m_rank != 0) {
      for (lVar2 = 0; end - begin >> 2 != lVar2; lVar2 = lVar2 + 1) {
        iVar3 = *(int *)(out + lVar2 * 4);
        if (iVar1 <= iVar3) {
          iVar3 = iVar1;
        }
        *(int *)(out + lVar2 * 4) = iVar3;
      }
    }
  }
  comm::~comm(&local_50);
  return;
}

Assistant:

void global_scan(InIterator begin, InIterator end, OutIterator out, Func func, const bool commutative, const mxx::comm& comm = mxx::comm()) {
    OutIterator o = out;
    size_t n = std::distance(begin, end);
    // create subcommunicator for those processes which contain elements
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        // local scan
        local_scan(begin, end, out, func);
        // mxx::scan
        typedef typename std::iterator_traits<OutIterator>::value_type T;
        T sum = *(out+(n-1));
        T presum = exscan(sum, func, nonzero_comm, commutative);
        if (nonzero_comm.rank() != 0) {
            // accumulate previous sum on all local elements
            for (size_t i = 0; i < n; ++i) {
                *o = func(presum, *o);
                ++o;
            }
        }
    }
}